

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  LodePNGColorType colortype;
  byte g_00;
  byte bVar5;
  uchar a_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong in_R10;
  undefined7 uVar11;
  ulong in_R11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  unsigned_short g;
  unsigned_short b;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  undefined2 local_122;
  undefined2 local_120;
  undefined2 local_11e;
  undefined2 local_11c;
  byte local_119;
  LodePNGColorStats *local_118;
  uint local_110;
  byte local_10c;
  uchar local_10b;
  byte local_10a;
  byte local_109;
  size_t local_108;
  uint local_fc;
  LodePNGColorMode *local_f8;
  uchar *local_f0;
  uint local_e4;
  ulong local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  size_t local_c0;
  ColorTree local_b8;
  
  local_108 = (ulong)h * (ulong)w;
  colortype = mode_in->colortype;
  local_f0 = in;
  uVar6 = lodepng_can_have_alpha(mode_in);
  uVar8 = mode_in->bitdepth;
  local_f8 = mode_in;
  uVar7 = getNumColorChannels(colortype);
  uVar7 = uVar7 * uVar8;
  uVar10 = stats->bits;
  bVar15 = uVar7 == 1 && uVar10 == 1;
  uVar13 = stats->numcolors;
  local_d4 = 0x101;
  if ((uVar7 < 9) && (local_d4 = (1 << ((byte)uVar7 & 0x1f)) + uVar13, 0x100 < local_d4)) {
    local_d4 = 0x101;
  }
  stats->numpixels = stats->numpixels + local_108;
  bVar16 = stats->allow_palette == 0;
  local_b8.children[0xc] = (ColorTree *)0x0;
  local_b8.children[0xd] = (ColorTree *)0x0;
  local_b8.children[0xe] = (ColorTree *)0x0;
  local_b8.children[0xf] = (ColorTree *)0x0;
  local_b8.children[8] = (ColorTree *)0x0;
  local_b8.children[9] = (ColorTree *)0x0;
  local_b8.children[10] = (ColorTree *)0x0;
  local_b8.children[0xb] = (ColorTree *)0x0;
  local_b8.children[4] = (ColorTree *)0x0;
  local_b8.children[5] = (ColorTree *)0x0;
  local_b8.children[6] = (ColorTree *)0x0;
  local_b8.children[7] = (ColorTree *)0x0;
  local_b8.children[0] = (ColorTree *)0x0;
  local_b8.children[1] = (ColorTree *)0x0;
  local_b8.children[2] = (ColorTree *)0x0;
  local_b8.children[3] = (ColorTree *)0x0;
  local_b8.index = -1;
  local_110 = 1;
  if (stats->alpha == 0) {
    local_110 = uVar6 ^ 1;
  }
  uVar6 = stats->colored;
  local_119 = uVar7 <= uVar10;
  bVar17 = (uVar10 == 0x10 || bVar16) || local_d4 <= uVar13;
  uVar14 = (ulong)uVar13;
  if ((uVar10 != 0x10 && !bVar16) && local_d4 > uVar13) {
    if (uVar13 == 0) {
      local_e0 = 0;
      uVar14 = local_e0;
    }
    else {
      local_118 = (LodePNGColorStats *)CONCAT71(local_118._1_7_,bVar15);
      uVar14 = 0;
      local_fc = uVar7;
      do {
        uVar10 = color_tree_add(&local_b8,stats->palette[uVar14 * 4],stats->palette[uVar14 * 4 + 1],
                                stats->palette[uVar14 * 4 + 2],stats->palette[uVar14 * 4 + 3],
                                (uint)uVar14);
        if (uVar10 != 0) goto LAB_0012a9da;
        uVar14 = uVar14 + 1;
      } while (uVar14 < stats->numcolors);
      uVar8 = local_f8->bitdepth;
      uVar7 = local_fc;
      uVar14 = (ulong)stats->numcolors;
      bVar15 = (byte)local_118;
    }
  }
  local_e0 = uVar14;
  uVar10 = (uint)((colortype & ~LCT_GREY_ALPHA) == LCT_GREY || uVar6 != 0);
  local_118 = stats;
  if (uVar8 == 0x10) {
    local_11e = 0;
    local_122 = 0;
    local_120 = 0;
    local_11c = 0;
    if (local_108 != 0) {
      sVar12 = 0;
      do {
        getPixelColorRGBA16(&local_11e,&local_122,&local_120,&local_11c,local_f0,sVar12,local_f8);
        if (((((local_11e & 0xff) != local_11e >> 8) || ((local_122 & 0xff) != local_122 >> 8)) ||
            ((local_120 & 0xff) != local_120 >> 8)) || ((local_11c & 0xff) != local_11c >> 8)) {
          stats->bits = 0x10;
          sVar12 = 0;
          local_11e = 0;
          local_122 = 0;
          local_120 = 0;
          local_11c = 0;
          uVar13 = local_110;
          goto LAB_0012aa39;
        }
        sVar12 = sVar12 + 1;
      } while (local_108 != sVar12);
    }
  }
  local_11e = (ushort)local_11e._1_1_ << 8;
  local_122 = (ushort)local_122._1_1_ << 8;
  local_120 = (ushort)local_120._1_1_ << 8;
  local_11c = (ushort)local_11c._1_1_ << 8;
  if (local_108 != 0) {
    local_119 = local_119 | bVar15;
    sVar12 = 0;
    local_fc = uVar7;
    do {
      getPixelColorRGBA8((uchar *)&local_11e,(uchar *)&local_122,(uchar *)&local_120,
                         (uchar *)&local_11c,local_f0,sVar12,local_f8);
      uVar13 = stats->bits;
      bVar15 = (byte)local_11e;
      if (uVar13 < 8 && (local_119 & 1) == 0) {
        uVar8 = 1;
        if ((1 < (byte)((byte)local_11e + 1)) && (uVar8 = 8, (byte)((byte)local_11e * -0xf) < 0x10))
        {
          uVar8 = (uint)(3 < (byte)((byte)local_11e * -3)) * 2 + 2;
        }
        if (uVar13 < uVar8) {
          stats->bits = uVar8;
          uVar13 = uVar8;
        }
      }
      local_119 = uVar7 <= uVar13;
      in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
      in_R10 = CONCAT71((int7)(in_R10 >> 8),1);
      uVar6 = 1;
      g_00 = (byte)local_122;
      bVar5 = (byte)local_120;
      uVar8 = uVar13;
      if (uVar10 == 0) {
        if ((byte)local_11e == (byte)local_122) {
          in_R10 = 0;
          uVar6 = 0;
          if ((byte)local_11e == (byte)local_120) goto LAB_0012a65e;
        }
        stats->colored = 1;
        uVar11 = (undefined7)(in_R10 >> 8);
        in_R10 = CONCAT71(uVar11,1);
        uVar6 = 1;
        if (uVar13 < 8) {
          stats->bits = 8;
          uVar8 = 8;
          in_R10 = CONCAT71(uVar11,1);
        }
      }
LAB_0012a65e:
      a_00 = (uchar)local_11c;
      if (local_110 == 0) {
        if ((stats->key_r == (local_11e & 0xff)) && (stats->key_g == (local_122 & 0xff))) {
          bVar16 = stats->key_b == (local_120 & 0xff);
        }
        else {
          bVar16 = false;
        }
        if ((uchar)local_11c == 0xff) {
          in_R11 = 0;
          local_110 = 0;
          if ((bool)(stats->key != 0 & bVar16)) {
            stats->alpha = 1;
            stats->key = 0;
            if (uVar8 < 8) goto LAB_0012a8cb;
            goto LAB_0012a665;
          }
        }
        else {
          if (((uchar)local_11c != '\0') || (!(bool)(stats->key == 0 | bVar16))) {
            stats->alpha = 1;
            stats->key = 0;
            if (uVar8 < 8) {
LAB_0012a8cb:
              stats->bits = 8;
              goto LAB_0012a665;
            }
            goto LAB_0012a668;
          }
          in_R11 = 0;
          local_110 = 0;
          if (stats->key == 0 && stats->alpha == 0) {
            stats->key = 1;
            stats->key_r = local_11e & 0xff;
            stats->key_g = local_122 & 0xff;
            stats->key_b = local_120 & 0xff;
            in_R11 = 0;
            local_110 = 0;
          }
        }
      }
      else {
LAB_0012a665:
        in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
LAB_0012a668:
        local_110 = 1;
      }
      bVar16 = true;
      if (bVar17) {
LAB_0012a679:
        bVar17 = bVar16;
        bVar15 = (byte)in_R11 & bVar17;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar15);
        bVar15 = (byte)in_R10 & bVar15;
        in_R10 = CONCAT71((int7)(in_R10 >> 8),bVar15);
        uVar10 = uVar6;
        if ((bVar15 == 1) && (uVar7 <= uVar13)) break;
      }
      else {
        local_d0 = (uint)in_R11;
        local_cc = (uint)in_R10;
        local_109 = (byte)local_122;
        local_c4 = (uint)(byte)local_120;
        local_e4 = uVar6;
        local_c8 = uVar13;
        local_c0 = sVar12;
        iVar9 = color_tree_get(&local_b8,(byte)local_11e,(byte)local_122,(byte)local_120,
                               (uchar)local_11c);
        bVar17 = false;
        sVar12 = local_c0;
        stats = local_118;
        uVar7 = local_fc;
        uVar10 = local_e4;
        if (iVar9 < 0) {
          local_10c = bVar15;
          local_10b = a_00;
          local_10a = bVar5;
          uVar10 = color_tree_add(&local_b8,bVar15,g_00,(uchar)local_c4,a_00,(uint)local_e0);
          if (uVar10 == 0) {
            uVar10 = local_118->numcolors;
            if ((ulong)uVar10 < 0x100) {
              uVar14 = (ulong)(uVar10 * 4);
              local_118->palette[(ulong)uVar10 * 4] = local_10c;
              local_118->palette[uVar14 + 1] = local_109;
              local_118->palette[uVar14 + 2] = local_10a;
              local_118->palette[uVar14 + 3] = local_10b;
            }
            uVar10 = uVar10 + 1;
            local_e0 = (ulong)uVar10;
            local_118->numcolors = uVar10;
            in_R10 = (ulong)local_cc;
            in_R11 = (ulong)local_d0;
            sVar12 = local_c0;
            stats = local_118;
            uVar7 = local_fc;
            uVar13 = local_c8;
            uVar6 = local_e4;
            bVar16 = local_d4 <= uVar10;
            goto LAB_0012a679;
          }
          goto LAB_0012a9da;
        }
      }
      sVar12 = sVar12 + 1;
    } while (local_108 != sVar12);
  }
  if ((stats->key != 0) && (local_118->alpha == 0 && local_108 != 0)) {
    sVar12 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_11e,(uchar *)&local_122,(uchar *)&local_120,
                         (uchar *)&local_11c,local_f0,sVar12,local_f8);
      if (((((uchar)local_11c != '\0') && (local_118->key_r == (local_11e & 0xff))) &&
          (local_118->key_g == (local_122 & 0xff))) && (local_118->key_b == (local_120 & 0xff))) {
        local_118->alpha = 1;
        local_118->key = 0;
        if (local_118->bits < 8) {
          local_118->bits = 8;
        }
      }
      sVar12 = sVar12 + 1;
    } while (local_108 != sVar12);
  }
  uVar1 = local_118->key_r;
  uVar2 = local_118->key_g;
  uVar3 = local_118->key_b;
  uVar4 = *(undefined2 *)&local_118->field_0xe;
  auVar18._6_2_ = uVar4;
  auVar18._4_2_ = uVar3;
  auVar18._2_2_ = uVar2;
  auVar18._0_2_ = uVar1;
  auVar18._8_8_ = 0;
  auVar19 = vpsllw_avx(auVar18,8);
  auVar18 = vpaddw_avx(auVar18,auVar19);
  local_118->key_r = (short)auVar18._0_4_;
  local_118->key_g = (short)((uint)auVar18._0_4_ >> 0x10);
  local_118->key_b = (short)(*(int *)&local_118->key_b << 8) + (short)*(int *)&local_118->key_b;
LAB_0012a9d7:
  uVar10 = 0;
LAB_0012a9da:
  color_tree_cleanup(&local_b8);
  return uVar10;
  while (sVar12 = sVar12 + 1, local_108 != sVar12) {
LAB_0012aa39:
    getPixelColorRGBA16(&local_11e,&local_122,&local_120,&local_11c,local_f0,sVar12,local_f8);
    bVar16 = true;
    bVar17 = uVar10 == 0;
    uVar10 = 1;
    if (bVar17) {
      if (local_11e == local_122) {
        bVar16 = false;
        uVar10 = 0;
        if (local_11e == local_120) goto LAB_0012aa9c;
      }
      local_118->colored = 1;
      bVar16 = true;
      uVar10 = 1;
    }
LAB_0012aa9c:
    if (uVar13 == 0) {
      if ((local_11e == local_118->key_r) && (local_122 == local_118->key_g)) {
        bVar17 = local_120 == local_118->key_b;
      }
      else {
        bVar17 = false;
      }
      if (local_11c == 0xffff) {
        uVar13 = 0;
        if ((bool)(local_118->key != 0 & bVar17)) goto LAB_0012ab3a;
      }
      else {
        if ((local_11c != 0) || (!(bool)(local_118->key == 0 | bVar17))) {
LAB_0012ab3a:
          local_118->alpha = 1;
          local_118->key = 0;
          goto LAB_0012ab4d;
        }
        uVar13 = 0;
        if (local_118->key == 0 && local_118->alpha == 0) {
          local_118->key = 1;
          local_118->key_r = local_11e;
          local_118->key_g = local_122;
          local_118->key_b = local_120;
        }
      }
    }
    else {
LAB_0012ab4d:
      uVar13 = 1;
      if (bVar16) break;
    }
  }
  if ((local_118->key != 0) && (local_118->alpha == 0)) {
    sVar12 = 0;
    do {
      getPixelColorRGBA16(&local_11e,&local_122,&local_120,&local_11c,local_f0,sVar12,local_f8);
      if ((((local_11c != 0) && (local_11e == local_118->key_r)) && (local_122 == local_118->key_g))
         && (local_120 == local_118->key_b)) {
        local_118->alpha = 1;
        local_118->key = 0;
      }
      sVar12 = sVar12 + 1;
    } while (local_108 != sVar12);
  }
  goto LAB_0012a9d7;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
  const unsigned char* in, unsigned w, unsigned h,
  const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if (bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if (!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if (stats->alpha) alpha_done = 1;
  if (stats->colored) colored_done = 1;
  if (stats->bits == 16) numcolors_done = 1;
  if (stats->bits >= bpp) bits_done = 1;
  if (stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if (!numcolors_done) {
    for (i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
      if (error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if (mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if ((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
        (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if (sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if (!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if (!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if (a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
        else if (a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        }
        else if (a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if (alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if (stats->key && !stats->alpha) {
      for (i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if (a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for (i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if (!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if (bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if (!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if (stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if (!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if (a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if (a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        }
        else if (a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if (!numcolors_done) {
        if (!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if (error) goto cleanup;
          if (stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if (alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if (stats->key && !stats->alpha) {
      for (i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if (a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if (stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}